

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O1

void kj::_::Debug::
     log<char_const(&)[75],capnproto_test::capnp::test::TestUnion::Union0::Which,capnproto_test::capnp::test::TestUnion::Union0::Which>
               (char *file,int line,LogSeverity severity,char *macroArgs,char (*params) [75],
               Which *params_1,Which *params_2)

{
  long lVar1;
  undefined8 uVar2;
  undefined8 *puVar3;
  ArrayPtr<kj::String> argValues_00;
  undefined4 in_register_00000014;
  long lVar4;
  String argValues [3];
  undefined1 in_stack_ffffffffffffff58 [14];
  Which WVar5;
  String local_98;
  String local_78;
  char *local_60;
  size_t local_58;
  ArrayDisposer *pAStack_50;
  char *local_48;
  size_t sStack_40;
  ArrayDisposer *pAStack_38;
  
  str<char_const(&)[75]>
            (&local_78,(kj *)params,(char (*) [75])CONCAT44(in_register_00000014,severity));
  str<unsigned_short>(&local_98,(unsigned_short *)&stack0xffffffffffffff66);
  local_60 = local_98.content.ptr;
  local_58 = local_98.content.size_;
  pAStack_50 = local_98.content.disposer;
  WVar5 = *params_2;
  str<unsigned_short>(&local_98,(unsigned_short *)&stack0xffffffffffffff66);
  local_48 = local_98.content.ptr;
  sStack_40 = local_98.content.size_;
  pAStack_38 = local_98.content.disposer;
  argValues_00.size_._6_2_ = WVar5;
  argValues_00._0_14_ = in_stack_ffffffffffffff58;
  logInternal((Debug *)file,(char *)(ulong)(uint)line,severity,(LogSeverity)macroArgs,
              (char *)&local_78,argValues_00);
  lVar4 = 0x30;
  do {
    lVar1 = *(long *)((long)&local_78.content.ptr + lVar4);
    if (lVar1 != 0) {
      uVar2 = *(undefined8 *)((long)&local_78.content.size_ + lVar4);
      *(undefined8 *)((long)&local_78.content.ptr + lVar4) = 0;
      *(undefined8 *)((long)&local_78.content.size_ + lVar4) = 0;
      puVar3 = *(undefined8 **)((long)&local_78.content.disposer + lVar4);
      (**(code **)*puVar3)(puVar3,lVar1,1,uVar2,uVar2,0);
    }
    lVar4 = lVar4 + -0x18;
  } while (lVar4 != -0x18);
  return;
}

Assistant:

void Debug::log(const char* file, int line, LogSeverity severity, const char* macroArgs,
                Params&&... params) {
  String argValues[sizeof...(Params)] = {str(params)...};
  logInternal(file, line, severity, macroArgs, arrayPtr(argValues, sizeof...(Params)));
}